

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall Matrix::FromArray(Matrix *this,double *data,int rows,int cols)

{
  undefined8 extraout_RDX;
  Matrix MVar1;
  int cols_local;
  int rows_local;
  double *data_local;
  Matrix *matrix;
  
  Matrix(this,rows,cols);
  std::copy<double*,double*>(data,data + rows * cols,this->data);
  MVar1.rows = (int)extraout_RDX;
  MVar1.cols = (int)((ulong)extraout_RDX >> 0x20);
  MVar1.data = (double *)this;
  return MVar1;
}

Assistant:

Matrix Matrix::FromArray(double* data, int rows, int cols)
{
    Matrix matrix(rows, cols);
    std::copy(data, data + rows * cols, matrix.data);

    return matrix;
}